

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_get_person(void)

{
  int iVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  allocator local_441;
  string local_440;
  type result;
  rpc_client client;
  
  std::__cxx11::string::string((string *)&result,"127.0.0.1",(allocator *)&local_440);
  rest_rpc::rpc_client::rpc_client(&client,(string *)&result,9000);
  std::__cxx11::string::~string((string *)&result);
  iVar1 = rest_rpc::rpc_client::connect(&client,3,(sockaddr *)0x0,in_ECX);
  if ((char)iVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string((string *)&local_440,"get_person",&local_441);
    rest_rpc::rpc_client::call<5000ul,person>(&result,&client,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&result.name);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&result.name);
  }
  rest_rpc::rpc_client::~rpc_client(&client);
  return;
}

Assistant:

void test_get_person() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result = client.call<person>("get_person");
    std::cout << result.name << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}